

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

int libtorrent::path_compare(string_view lhs,string_view lfile,string_view rhs,string_view rfile)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  difference_type __diff;
  ulong uVar4;
  size_t sVar5;
  string_view p;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  char *local_80;
  ulong local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  p._M_str = lfile._M_str;
  local_78 = lfile._M_len;
  p._M_len = (size_t)lhs._M_str;
  local_80 = p._M_str;
  lsplit_path(&local_a8,(libtorrent *)lhs._M_len,p);
  p_00._M_str = p._M_str;
  p_00._M_len = (size_t)rhs._M_str;
  lsplit_path(&local_c8,(libtorrent *)rhs._M_len,p_00);
  if (local_a8.first._M_len != 0) {
    do {
      sVar5 = local_a8.first._M_len;
      if (local_c8.first._M_len == 0) {
        local_c8.first._M_len = rfile._M_len;
        local_c8.first._M_str = rfile._M_str;
        goto LAB_00238bfc;
      }
      sVar3 = local_c8.first._M_len;
      if (local_a8.first._M_len < local_c8.first._M_len) {
        sVar3 = local_a8.first._M_len;
      }
      uVar1 = memcmp(local_a8.first._M_str,local_c8.first._M_str,sVar3);
      uVar2 = (ulong)uVar1;
      if (uVar1 != 0) goto LAB_00238c50;
      local_c8.first._M_len = sVar5 - local_c8.first._M_len;
      if (local_c8.first._M_len != 0) {
        uVar2 = 0xffffffff80000000;
        if (-0x80000000 < (long)local_c8.first._M_len) {
          uVar2 = local_c8.first._M_len;
        }
        goto LAB_00238c44;
      }
      p_01._M_str = p._M_str;
      p_01._M_len = (size_t)local_a8.second._M_str;
      lsplit_path(&local_50,(libtorrent *)local_a8.second._M_len,p_01);
      local_a8.first._M_len = local_50.first._M_len;
      local_a8.first._M_str = local_50.first._M_str;
      local_a8.second._M_len = local_50.second._M_len;
      local_a8.second._M_str = local_50.second._M_str;
      p_02._M_str = p._M_str;
      p_02._M_len = (size_t)local_c8.second._M_str;
      lsplit_path(&local_70,(libtorrent *)local_c8.second._M_len,p_02);
      local_c8.first._M_len = local_70.first._M_len;
      local_c8.first._M_str = local_70.first._M_str;
      local_c8.second._M_len = local_70.second._M_len;
      local_c8.second._M_str = local_70.second._M_str;
    } while (local_a8.first._M_len != 0);
  }
  if (local_c8.first._M_len == 0) {
    uVar2 = 0;
  }
  else {
    local_a8.first._M_str = local_80;
    sVar5 = local_78;
LAB_00238bfc:
    uVar4 = sVar5 - local_c8.first._M_len;
    sVar3 = local_c8.first._M_len;
    if (sVar5 < local_c8.first._M_len) {
      sVar3 = sVar5;
    }
    if (sVar3 != 0) {
      uVar1 = memcmp(local_a8.first._M_str,local_c8.first._M_str,sVar3);
      uVar2 = (ulong)uVar1;
      if (uVar1 != 0) goto LAB_00238c50;
    }
    uVar2 = 0xffffffff80000000;
    if (-0x80000000 < (long)uVar4) {
      uVar2 = uVar4;
    }
LAB_00238c44:
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0x7fffffff;
    }
  }
LAB_00238c50:
  return (int)uVar2;
}

Assistant:

int path_compare(string_view const lhs, string_view const lfile
		, string_view const rhs, string_view const rfile)
	{
		for (auto lhs_elems = lsplit_path(lhs), rhs_elems = lsplit_path(rhs);
			!lhs_elems.first.empty() || !rhs_elems.first.empty();
			lhs_elems = lsplit_path(lhs_elems.second), rhs_elems = lsplit_path(rhs_elems.second))
		{
			if (lhs_elems.first.empty() || rhs_elems.first.empty())
			{
				if (lhs_elems.first.empty()) lhs_elems.first = lfile;
				if (rhs_elems.first.empty()) rhs_elems.first = rfile;
				return lhs_elems.first.compare(rhs_elems.first);
			}

			int const ret = lhs_elems.first.compare(rhs_elems.first);
			if (ret != 0) return ret;
		}
		return 0;
	}